

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf_write.h
# Opt level: O0

void cgltf_write_indent(cgltf_write_context *context)

{
  int iVar1;
  int local_14;
  int i;
  cgltf_write_context *context_local;
  
  if (context->needs_comma == 0) {
    iVar1 = snprintf(context->cursor,context->remaining,"\n");
    context->tmp = (long)iVar1;
    context->chars_written = context->tmp + context->chars_written;
    if (context->cursor != (char *)0x0) {
      context->cursor = context->cursor + context->tmp;
      context->remaining = context->remaining - context->tmp;
    }
  }
  else {
    iVar1 = snprintf(context->cursor,context->remaining,",\n");
    context->tmp = (long)iVar1;
    context->chars_written = context->tmp + context->chars_written;
    if (context->cursor != (char *)0x0) {
      context->cursor = context->cursor + context->tmp;
      context->remaining = context->remaining - context->tmp;
    }
    context->needs_comma = 0;
  }
  for (local_14 = 0; local_14 < context->depth; local_14 = local_14 + 1) {
    iVar1 = snprintf(context->cursor,context->remaining,"%s",context->indent);
    context->tmp = (long)iVar1;
    context->chars_written = context->tmp + context->chars_written;
    if (context->cursor != (char *)0x0) {
      context->cursor = context->cursor + context->tmp;
      context->remaining = context->remaining - context->tmp;
    }
  }
  return;
}

Assistant:

static void cgltf_write_indent(cgltf_write_context* context)
{
	if (context->needs_comma)
	{
		CGLTF_SPRINTF(",\n");
		context->needs_comma = 0;
	}
	else
	{
		CGLTF_SPRINTF("\n");
	}
	for (int i = 0; i < context->depth; ++i)
	{
		CGLTF_SPRINTF("%s", context->indent);
	}
}